

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O1

uint64_t farmhash64_xo(char *s,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  uint64_t uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  if (len < 0x21) {
    if (len < 0x11) {
      if (len < 8) {
        if (len < 4) {
          if (len == 0) {
            return 0x9ae16a3b2f90404f;
          }
          uVar7 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x3c5a37a36834ced9 ^
                  (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
          return (uVar7 >> 0x2f ^ uVar7) * -0x651e95c4d06fbfb1;
        }
        lVar5 = len * 2 + -0x651e95c4d06fbfb1;
        uVar7 = (len + (ulong)*(uint *)s * 8 ^ (ulong)*(uint *)(s + (len - 4))) * lVar5;
        uVar7 = (uVar7 >> 0x2f ^ *(uint *)(s + (len - 4)) ^ uVar7) * lVar5;
        uVar7 = uVar7 >> 0x2f ^ uVar7;
      }
      else {
        lVar5 = len * 2 + -0x651e95c4d06fbfb1;
        uVar1 = *(long *)s + 0x9ae16a3b2f90404f;
        uVar7 = *(ulong *)(s + (len - 8));
        uVar2 = ((uVar1 >> 0x19 | uVar1 << 0x27) + uVar7) * lVar5;
        uVar7 = ((uVar7 >> 0x25 | uVar7 << 0x1b) * lVar5 + uVar1 ^ uVar2) * lVar5;
        uVar7 = (uVar7 >> 0x2f ^ uVar2 ^ uVar7) * lVar5;
        uVar7 = uVar7 >> 0x2f ^ uVar7;
      }
    }
    else {
      lVar5 = len * 2 + -0x651e95c4d06fbfb1;
      uVar2 = *(long *)(s + (len - 8)) * lVar5;
      uVar7 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
      uVar1 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
      uVar1 = (uVar1 >> 0x12 | uVar1 << 0x2e) + *(long *)s * -0x4b6d499041670d8d + uVar2;
      uVar7 = ((uVar2 >> 0x1e | uVar2 << 0x22) + (uVar7 >> 0x2b | uVar7 * 0x200000) +
               *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1 ^ uVar1) * lVar5;
      uVar7 = (uVar7 >> 0x2f ^ uVar1 ^ uVar7) * lVar5;
      uVar7 = uVar7 >> 0x2f ^ uVar7;
    }
LAB_0018168a:
    return uVar7 * lVar5;
  }
  if (len < 0x41) {
    lVar5 = len * 2 + -0x651e95c4d06fbfcf;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = *(ulong *)(s + (len - 0x20));
    auVar23._8_8_ = 0;
    auVar23._0_8_ = *(ulong *)s;
    auVar21 = vpunpcklqdq_avx(auVar21,auVar23);
    auVar22._8_8_ = 0xb492b66fbe98f273;
    auVar22._0_8_ = 0xb492b66fbe98f273;
    auVar17 = vpmullq_avx512vl(auVar21,auVar22);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = *(ulong *)(s + (len - 8));
    auVar19._8_8_ = 0;
    auVar19._0_8_ = *(ulong *)(s + 0x18);
    auVar21 = vpunpcklqdq_avx(auVar18,auVar19);
    auVar20._8_8_ = 0x9ae16a3b2f904031;
    auVar20._0_8_ = 0x9ae16a3b2f904031;
    auVar23 = vpinsrq_avx(auVar20,lVar5,0);
    auVar18 = vpmullq_avx512vl(auVar21,auVar23);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = *(ulong *)(s + (len - 0x10));
    auVar25._8_8_ = 0;
    auVar25._0_8_ = *(ulong *)(s + 0x10);
    auVar21 = vpunpcklqdq_avx(auVar24,auVar25);
    auVar26._8_8_ = 0x9ae16a3b2f90404f;
    auVar26._0_8_ = 0x9ae16a3b2f90404f;
    auVar19 = vpmullq_avx512vl(auVar21,auVar26);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = *(ulong *)(s + (len - 0x18));
    auVar28._8_8_ = 0;
    auVar28._0_8_ = *(ulong *)(s + 8);
    auVar22 = vpunpcklqdq_avx(auVar27,auVar28);
    auVar21 = vpaddq_avx(auVar17,auVar22);
    auVar20 = vprolq_avx512vl(auVar21,0x15);
    auVar21 = vprolq_avx512vl(auVar18,0x22);
    auVar21 = vpaddq_avx(auVar21,auVar19);
    auVar21 = vpaddq_avx(auVar21,auVar20);
    auVar22 = vpaddq_avx(auVar22,auVar26);
    auVar22 = vprolq_avx512vl(auVar22,0x2e);
    auVar22 = vpaddq_avx(auVar22,auVar18);
    auVar22 = vpaddq_avx(auVar22,auVar17);
    auVar21 = vpmullq_avx512vl(auVar21 ^ auVar22,auVar23);
    auVar17 = vpsrlq_avx(auVar21,0x2f);
    auVar21 = vpternlogq_avx512vl(auVar17,auVar22,auVar21,0x96);
    auVar21 = vpmullq_avx512vl(auVar21,auVar23);
    auVar22 = vpsrlq_avx(auVar21,0x2f);
    lVar3 = vpextrq_avx(auVar22 ^ auVar21,1);
    uVar7 = lVar3 + SUB168(auVar22 ^ auVar21,0) * lVar5;
    goto LAB_0018168a;
  }
  if (len < 0x61) {
    lVar5 = len * 2 + -0x651e95c4d06fc023;
    uVar1 = *(long *)(s + 0x18) * -0x651e95c4d06fc023;
    uVar7 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
    uVar2 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
    uVar2 = (uVar2 >> 0x12 | uVar2 << 0x2e) + *(long *)s * -0x4b6d499041670d8d + uVar1;
    uVar7 = ((uVar1 >> 0x1e | uVar1 << 0x22) + (uVar7 >> 0x2b | uVar7 * 0x200000) +
             *(long *)(s + 0x10) * -0x651e95c4d06fbfb1 ^ uVar2) * -0x651e95c4d06fc023;
    uVar2 = (uVar7 >> 0x2f ^ uVar2 ^ uVar7) * -0x651e95c4d06fc023;
    uVar15 = *(long *)(s + 0x38) * lVar5;
    uVar7 = *(long *)(s + 0x20) * -0x4b6d499041670d8d + *(long *)(s + 0x28);
    uVar1 = *(long *)(s + 0x28) + 0x9ae16a3b2f90404f;
    uVar1 = (uVar1 >> 0x12 | uVar1 << 0x2e) + *(long *)(s + 0x20) * -0x4b6d499041670d8d + uVar15;
    uVar7 = ((uVar15 >> 0x1e | uVar15 << 0x22) + (uVar7 >> 0x2b | uVar7 * 0x200000) +
             *(long *)(s + 0x30) * -0x651e95c4d06fbfb1 ^ uVar1) * lVar5;
    uVar1 = (uVar7 >> 0x2f ^ uVar1 ^ uVar7) * lVar5;
    uVar16 = *(long *)(s + (len - 8)) * lVar5;
    uVar7 = *(long *)(s + (len - 0x20)) * -0x4b6d499041670d8d + *(long *)(s + (len - 0x18));
    uVar15 = *(long *)(s + (len - 0x18)) + 0x9ae16a3b2f90404f;
    uVar15 = (uVar15 >> 0x12 | uVar15 << 0x2e) + *(long *)(s + (len - 0x20)) * -0x4b6d499041670d8d +
             uVar16 + (uVar1 >> 0x2f ^ uVar1);
    uVar7 = ((uVar16 >> 0x1e | uVar16 << 0x22) + (uVar7 >> 0x2b | uVar7 * 0x200000) +
             *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1 + (uVar2 >> 0x2f ^ uVar2) ^ uVar15) *
            lVar5;
    uVar7 = (uVar7 >> 0x2f ^ uVar15 ^ uVar7) * lVar5;
    return ((uVar1 >> 0x15) + (uVar2 >> 0x11) + (uVar7 >> 0x2f ^ uVar7) * 9) * lVar5;
  }
  if (0x100 < len) {
    uVar4 = farmhash64_uo(s,len);
    return uVar4;
  }
  if (len < 0x21) {
    if (len < 0x11) {
      if (len < 8) {
        if (len < 4) {
          if (len == 0) {
            return 0x9ae16a3b2f90404f;
          }
          uVar7 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x3c5a37a36834ced9 ^
                  (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
          return (uVar7 >> 0x2f ^ uVar7) * -0x651e95c4d06fbfb1;
        }
        lVar5 = len * 2 + -0x651e95c4d06fbfb1;
        uVar7 = (len + (ulong)*(uint *)s * 8 ^ (ulong)*(uint *)(s + (len - 4))) * lVar5;
        uVar7 = (uVar7 >> 0x2f ^ *(uint *)(s + (len - 4)) ^ uVar7) * lVar5;
        uVar7 = uVar7 >> 0x2f ^ uVar7;
      }
      else {
        lVar5 = len * 2 + -0x651e95c4d06fbfb1;
        uVar1 = *(long *)s + 0x9ae16a3b2f90404f;
        uVar7 = *(ulong *)(s + (len - 8));
        uVar2 = ((uVar1 >> 0x19 | uVar1 << 0x27) + uVar7) * lVar5;
        uVar7 = ((uVar7 >> 0x25 | uVar7 << 0x1b) * lVar5 + uVar1 ^ uVar2) * lVar5;
        uVar7 = (uVar7 >> 0x2f ^ uVar2 ^ uVar7) * lVar5;
        uVar7 = uVar7 >> 0x2f ^ uVar7;
      }
      goto LAB_00180d1e;
    }
    lVar5 = len * 2 + -0x651e95c4d06fbfb1;
    uVar1 = *(long *)(s + (len - 8)) * lVar5;
    uVar7 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
    uVar2 = (uVar1 >> 0x1e | uVar1 << 0x22) + (uVar7 >> 0x2b | uVar7 * 0x200000) +
            *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1;
    uVar7 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
    uVar1 = (uVar7 >> 0x12 | uVar7 << 0x2e) + *(long *)s * -0x4b6d499041670d8d + uVar1;
  }
  else {
    if (0x40 < len) {
      uVar1 = len - 1 & 0xffffffffffffffc0;
      uVar7 = (ulong)((uint)(len - 1) & 0x3f);
      if (s + (len - 0x40) == s + (uVar7 - 0x3f) + uVar1) {
        lVar5 = uVar7 + uVar1;
        lVar9 = *(long *)s + 0x1529cba0ca458ff;
        lVar11 = 0x226bb95b4e64b6d4;
        uVar15 = 0x134a747f856d0526;
        uVar16 = 0;
        lVar8 = 0;
        uVar2 = 0;
        lVar14 = 0;
        lVar3 = 0;
        do {
          uVar10 = lVar9 + lVar14 + lVar11 + *(long *)(s + uVar16 + 8);
          uVar12 = lVar11 + lVar3 + *(long *)(s + uVar16 + 0x30);
          lVar11 = lVar14 + *(long *)(s + uVar16 + 0x28) +
                   (uVar12 >> 0x2a | uVar12 * 0x400000) * -0x4b6d499041670d8d;
          uVar12 = uVar15 + lVar8;
          lVar3 = lVar3 * -0x4b6d499041670d8d + *(long *)(s + uVar16);
          uVar13 = *(long *)(s + uVar16 + 8) + lVar3 + *(long *)(s + uVar16 + 0x10);
          lVar14 = uVar13 + *(long *)(s + uVar16 + 0x18);
          uVar15 = (uVar10 >> 0x25 | uVar10 * 0x8000000) * -0x4b6d499041670d8d ^ uVar2;
          lVar9 = (uVar12 >> 0x21 | uVar12 * 0x80000000) * -0x4b6d499041670d8d;
          uVar10 = lVar8 + lVar3 + *(long *)(s + uVar16 + 0x18) + uVar15;
          lVar3 = lVar3 + (uVar13 >> 0x2c | uVar13 * 0x100000) + (uVar10 >> 0x15 | uVar10 << 0x2b);
          lVar6 = uVar2 + lVar9 + *(long *)(s + uVar16 + 0x20);
          uVar10 = *(long *)(s + uVar16 + 0x10) + lVar6 + lVar11 + *(long *)(s + uVar16 + 0x38);
          uVar2 = *(long *)(s + uVar16 + 0x28) + *(long *)(s + uVar16 + 0x30) + lVar6;
          lVar8 = uVar2 + *(long *)(s + uVar16 + 0x38);
          uVar2 = lVar6 + (uVar2 >> 0x2c | uVar2 * 0x100000) + (uVar10 >> 0x15 | uVar10 << 0x2b);
          uVar16 = uVar16 + 0x40;
        } while (uVar1 != uVar16);
        lVar6 = (uVar15 & 0xff) * 2 + -0x4b6d499041670d8d;
        lVar14 = lVar14 + lVar8 + uVar7;
        lVar8 = lVar8 + uVar7 + lVar14;
        uVar7 = lVar9 + lVar11 + *(long *)(s + lVar5 + -0x37) + lVar14;
        uVar1 = lVar11 + lVar3 + *(long *)(s + lVar5 + -0xf);
        uVar10 = uVar2 * 9 ^ (uVar7 >> 0x25 | uVar7 * 0x8000000) * lVar6;
        uVar12 = lVar14 * 9 + *(long *)(s + lVar5 + -0x17) +
                 (uVar1 >> 0x2a | uVar1 * 0x400000) * lVar6;
        uVar15 = uVar15 + lVar8;
        uVar15 = uVar15 >> 0x21 | uVar15 * 0x80000000;
        lVar3 = lVar3 * lVar6 + *(long *)(s + lVar5 + -0x3f);
        uVar16 = lVar8 + lVar3 + uVar10 + *(long *)(s + lVar5 + -0x27);
        uVar13 = *(long *)(s + lVar5 + -0x37) + *(long *)(s + lVar5 + -0x2f) + lVar3;
        lVar8 = uVar15 * lVar6 + uVar2 + *(long *)(s + lVar5 + -0x1f);
        uVar2 = *(long *)(s + lVar5 + -0x2f) + uVar12 + *(long *)(s + lVar5 + -7) + lVar8;
        uVar7 = *(long *)(s + lVar5 + -0x17) + *(long *)(s + lVar5 + -0xf) + lVar8;
        uVar1 = uVar7 + *(long *)(s + lVar5 + -7);
        uVar7 = (uVar7 >> 0x2c | uVar7 * 0x100000) + lVar8 + (uVar2 >> 0x15 | uVar2 << 0x2b);
        uVar2 = (uVar13 + *(long *)(s + lVar5 + -0x27) ^ uVar1) * lVar6;
        uVar2 = (uVar2 >> 0x2f ^ uVar1 ^ uVar2) * lVar6;
        uVar1 = ((uVar13 >> 0x2c | uVar13 * 0x100000) + lVar3 + (uVar16 >> 0x15 | uVar16 << 0x2b) ^
                uVar7) * lVar6;
        uVar7 = (uVar1 >> 0x2f ^ uVar7 ^ uVar1) * lVar6;
        uVar7 = ((uVar7 >> 0x2f ^ uVar7) + uVar15) * lVar6;
        uVar1 = ((uVar12 >> 0x2f ^ uVar12) * -0x3c5a37a36834ced9 + uVar10 +
                 (uVar2 >> 0x2f ^ uVar2) * lVar6 ^ uVar7) * lVar6;
        uVar7 = (uVar1 >> 0x2f ^ uVar7 ^ uVar1) * lVar6;
        return (uVar7 >> 0x2f ^ uVar7) * lVar6;
      }
      __assert_fail("s + len - 64 == last64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/farmhash-c.c"
                    ,0x1b1,"uint64_t farmhash64_na(const char *, size_t)");
    }
    lVar5 = len * 2 + -0x651e95c4d06fbfb1;
    lVar3 = *(long *)s * -0x651e95c4d06fbfb1;
    uVar1 = *(long *)(s + (len - 8)) * lVar5;
    uVar7 = lVar3 + *(long *)(s + 8);
    uVar7 = (uVar1 >> 0x1e | uVar1 << 0x22) + (uVar7 >> 0x2b | uVar7 * 0x200000) +
            *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1;
    uVar2 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
    uVar1 = (uVar2 >> 0x12 | uVar2 << 0x2e) + lVar3 + uVar1;
    uVar2 = (uVar7 ^ uVar1) * lVar5;
    uVar2 = (uVar2 >> 0x2f ^ uVar1 ^ uVar2) * lVar5;
    uVar1 = (uVar7 + *(long *)(s + (len - 0x20))) * lVar5;
    uVar7 = *(long *)(s + 0x10) * lVar5 + *(long *)(s + 0x18);
    uVar2 = (uVar1 >> 0x1e | uVar1 << 0x22) + (uVar7 >> 0x2b | uVar7 * 0x200000) +
            ((uVar2 >> 0x2f ^ uVar2) * lVar5 + *(long *)(s + (len - 0x18))) * lVar5;
    uVar7 = lVar3 + *(long *)(s + 0x18);
    uVar1 = (uVar7 >> 0x12 | uVar7 << 0x2e) + *(long *)(s + 0x10) * lVar5 + uVar1;
  }
  uVar7 = (uVar2 ^ uVar1) * lVar5;
  uVar7 = (uVar7 >> 0x2f ^ uVar1 ^ uVar7) * lVar5;
  uVar7 = uVar7 >> 0x2f ^ uVar7;
LAB_00180d1e:
  return uVar7 * lVar5;
}

Assistant:

uint64_t farmhash64_xo(const char *s, size_t len) {
  if (len <= 32) {
    if (len <= 16) {
      return farmhash_na_len_0_to_16(s, len);
    } else {
      return farmhash_na_len_17_to_32(s, len);
    }
  } else if (len <= 64) {
    return farmhash_xo_len_33_to_64(s, len);
  } else if (len <= 96) {
    return farmhash_xo_len_65_to_96(s, len);
  } else if (len <= 256) {
    return farmhash64_na(s, len);
  } else {
    return farmhash64_uo(s, len);
  }
}